

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_bucket.c
# Opt level: O0

pair bucket_get_pair(bucket b,comparable_callback compare_cb,void *key)

{
  int iVar1;
  pair ppVar2;
  undefined8 in_RDX;
  code *in_RSI;
  ulong *in_RDI;
  pair p;
  size_t iterator;
  ulong local_28;
  
  if ((in_RDI[2] != 0) && (*in_RDI != 0)) {
    for (local_28 = 0; local_28 < *in_RDI; local_28 = local_28 + 1) {
      ppVar2 = (pair)(in_RDI[2] + local_28 * 0x10);
      iVar1 = (*in_RSI)(in_RDX,ppVar2->key);
      if (iVar1 == 0) {
        return ppVar2;
      }
    }
  }
  return (pair)0x0;
}

Assistant:

pair bucket_get_pair(bucket b, comparable_callback compare_cb, void *key)
{
	size_t iterator;

	if (b->pairs == NULL || b->count == 0)
	{
		return NULL;
	}

	for (iterator = 0; iterator < b->count; ++iterator)
	{
		pair p = &b->pairs[iterator];

		if (compare_cb(key, p->key) == 0)
		{
			return p;
		}
	}

	return NULL;
}